

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_data.hpp
# Opt level: O2

void duckdb::ArrowListData<long>::AppendOffsets
               (ArrowAppendData *append_data,UnifiedVectorFormat *format,idx_t from,idx_t to,
               vector<unsigned_int,_true> *child_sel)

{
  int *piVar1;
  sel_t *psVar2;
  long lVar3;
  bool bVar4;
  ArrowBuffer *this;
  idx_t iVar5;
  idx_t k;
  long lVar6;
  idx_t i;
  ulong row_idx;
  long local_78;
  uint local_6c;
  data_ptr_t local_68;
  ArrowAppendData *local_60;
  UnifiedVectorFormat *local_58;
  data_ptr_t local_50;
  idx_t local_48;
  TemplatedValidityMask<unsigned_long> *local_40;
  idx_t local_38;
  
  local_58 = format;
  this = ArrowAppendData::GetMainBuffer(append_data);
  ArrowBuffer::resize(this,this->count + (to - from) * 8 + 8);
  local_50 = local_58->data;
  local_68 = this->dataptr;
  iVar5 = append_data->row_count;
  if (iVar5 == 0) {
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    iVar5 = append_data->row_count;
  }
  local_78 = *(long *)(local_68 + iVar5 * 8);
  local_40 = &(local_58->validity).super_TemplatedValidityMask<unsigned_long>;
  local_60 = append_data;
  local_48 = to;
  local_38 = from;
  for (; from < to; from = from + 1) {
    psVar2 = local_58->sel->sel_vector;
    row_idx = from;
    if (psVar2 != (sel_t *)0x0) {
      row_idx = (ulong)psVar2[from];
    }
    lVar6 = (from - local_38) + local_60->row_count + 1;
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_40,row_idx);
    if (bVar4) {
      piVar1 = (int *)(local_50 + row_idx * 0x10);
      lVar3 = *(long *)(local_50 + row_idx * 0x10 + 8);
      local_78 = local_78 + lVar3;
      *(long *)(local_68 + lVar6 * 8) = local_78;
      for (lVar6 = 0; to = local_48, lVar3 != lVar6; lVar6 = lVar6 + 1) {
        local_6c = *piVar1 + (int)lVar6;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,&local_6c);
      }
    }
    else {
      *(long *)(local_68 + lVar6 * 8) = local_78;
    }
  }
  return;
}

Assistant:

static void AppendOffsets(ArrowAppendData &append_data, UnifiedVectorFormat &format, idx_t from, idx_t to,
	                          vector<sel_t> &child_sel) {
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		idx_t size = to - from;
		auto &main_buffer = append_data.GetMainBuffer();

		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<list_entry_t>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// set up the offsets using the list entries
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				offset_data[offset_idx] = last_offset;
				continue;
			}

			// append the offset data
			auto list_length = data[source_idx].length;
			if (std::is_same<BUFTYPE, int32_t>::value == true &&
			    (uint64_t)last_offset + list_length > NumericLimits<int32_t>::Maximum()) {
				throw InvalidInputException(
				    "Arrow Appender: The maximum combined list offset for regular list buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), last_offset);
			}
			last_offset += list_length;
			offset_data[offset_idx] = last_offset;

			for (idx_t k = 0; k < list_length; k++) {
				child_sel.push_back(UnsafeNumericCast<sel_t>(data[source_idx].offset + k));
			}
		}
	}